

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O2

void __thiscall MeCab::ContextID::addBOS(ContextID *this,char *l,char *r)

{
  std::__cxx11::string::assign((char *)&this->left_bos_);
  std::__cxx11::string::assign((char *)&this->right_bos_);
  return;
}

Assistant:

void ContextID::addBOS(const char *l, const char *r) {
  left_bos_ = l;
  right_bos_ = r;
}